

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpDecoderImpl::read_rgb_data(BmpDecoderImpl *this)

{
  undefined1 uVar1;
  _Ios_Seekdir _Var2;
  int x;
  int iVar3;
  undefined1 *puVar4;
  Int32 IVar5;
  uint uVar6;
  ulong new_size;
  undefined1 *puVar7;
  
  uVar6 = (this->info_header).width * 3;
  new_size = (ulong)((this->info_header).height * uVar6);
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::resize(&(this->pixels).super_void_vector_base,new_size);
  _Var2 = 4 - (uVar6 & 3);
  if ((uVar6 & 3) == 0) {
    _Var2 = _S_beg;
  }
  IVar5 = (this->info_header).height;
  puVar4 = (undefined1 *)
           ((long)(this->pixels).super_void_vector_base.m_data + (new_size - uVar6) + 2);
  while (0 < IVar5) {
    IVar5 = IVar5 + -1;
    puVar7 = puVar4;
    for (iVar3 = 0; iVar3 < (this->info_header).width; iVar3 = iVar3 + 1) {
      uVar1 = std::istream::get();
      *puVar7 = uVar1;
      uVar1 = std::istream::get();
      puVar7[-1] = uVar1;
      uVar1 = std::istream::get();
      puVar7[-2] = uVar1;
      puVar7 = puVar7 + 3;
    }
    std::istream::seekg((long)this,_Var2);
    puVar4 = puVar4 + -(ulong)uVar6;
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_rgb_data ()
{
    const unsigned int line_size = 3 * info_header.width;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each scanline.
    // citing Kevin D. Quitt's mail to wotsit.org:
    // In RGB encoding (no compression), when using 8 bits per pixel, lines
    // must start on a long-word boundary (i.e., low two bits zero).
    const unsigned int pad_size = (line_size % 4) ? 4 - (line_size % 4) : 0;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {
            mover[2] = stream.get(); // B
            mover[1] = stream.get(); // G
            mover[0] = stream.get(); // R
            mover += 3;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}